

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.hh
# Opt level: O1

void __thiscall Typelib::BadName::BadName(BadName *this,string *name)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)local_40);
  std::runtime_error::runtime_error((runtime_error *)this,(string *)local_40);
  *(undefined ***)&this->super_RegistryException = &PTR__runtime_error_0015c110;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  *(undefined ***)&this->super_RegistryException = &PTR__BadName_0015c160;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  return;
}

Assistant:

BadName(const std::string& name)
            : RegistryException(name + " is not a valid type name")
            , m_name(name) {}